

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlangs.c
# Opt level: O1

double zlangs(char *norm,SuperMatrix *A)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  void *__s;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  doublecomplex *pdVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  char msg [256];
  char local_138 [264];
  
  iVar1 = A->nrow;
  iVar3 = A->ncol;
  if (iVar1 < A->ncol) {
    iVar3 = iVar1;
  }
  dVar11 = 0.0;
  if (iVar3 == 0) {
    return 0.0;
  }
  pvVar2 = A->Store;
  lVar5 = *(long *)((long)pvVar2 + 8);
  switch(*norm) {
  case 'E':
  case 'F':
    pcVar6 = "Not implemented.";
    uVar4 = 0x75;
    goto LAB_00116aac;
  case 'I':
    __s = superlu_malloc((long)iVar1 << 3);
    if (__s == (void *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork.",0x67,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zlangs.c");
      superlu_abort_and_exit(local_138);
    }
    if (0 < (long)A->nrow) {
      memset(__s,0,(long)A->nrow << 3);
    }
    if (0 < A->ncol) {
      lVar7 = 0;
      do {
        iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar7 * 4);
        lVar10 = (long)iVar1;
        lVar8 = lVar7 + 1;
        if (iVar1 < *(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + lVar7 * 4)) {
          pdVar9 = (doublecomplex *)(lVar10 * 0x10 + lVar5);
          do {
            lVar7 = (long)*(int *)(*(long *)((long)pvVar2 + 0x10) + lVar10 * 4);
            dVar11 = z_abs(pdVar9);
            *(double *)((long)__s + lVar7 * 8) = dVar11 + *(double *)((long)__s + lVar7 * 8);
            lVar10 = lVar10 + 1;
            pdVar9 = pdVar9 + 1;
          } while (lVar10 < *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar8 * 4));
        }
        lVar7 = lVar8;
      } while (lVar8 < A->ncol);
    }
    dVar11 = 0.0;
    if (0 < (long)A->nrow) {
      lVar5 = 0;
      do {
        dVar13 = *(double *)((long)__s + lVar5 * 8);
        if (dVar11 <= dVar13) {
          dVar11 = dVar13;
        }
        lVar5 = lVar5 + 1;
      } while (A->nrow != lVar5);
    }
    superlu_free(__s);
    break;
  case 'M':
    if (0 < A->ncol) {
      dVar11 = 0.0;
      lVar7 = 0;
      do {
        iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar7 * 4);
        lVar8 = (long)iVar1;
        lVar10 = lVar7 + 1;
        if (iVar1 < *(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + lVar7 * 4)) {
          pdVar9 = (doublecomplex *)(lVar8 * 0x10 + lVar5);
          do {
            dVar13 = z_abs(pdVar9);
            if (dVar11 <= dVar13) {
              dVar11 = z_abs(pdVar9);
            }
            lVar8 = lVar8 + 1;
            pdVar9 = pdVar9 + 1;
          } while (lVar8 < *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar10 * 4));
        }
        lVar7 = lVar10;
      } while (lVar10 < A->ncol);
    }
    break;
  case 'O':
switchD_001169dd_caseD_4f:
    if (0 < A->ncol) {
      dVar11 = 0.0;
      lVar7 = 0;
      do {
        iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar7 * 4);
        lVar8 = (long)iVar1;
        lVar10 = lVar7 + 1;
        dVar13 = 0.0;
        if (iVar1 < *(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + lVar7 * 4)) {
          pdVar9 = (doublecomplex *)(lVar8 * 0x10 + lVar5);
          do {
            dVar12 = z_abs(pdVar9);
            dVar13 = dVar13 + dVar12;
            lVar8 = lVar8 + 1;
            pdVar9 = pdVar9 + 1;
          } while (lVar8 < *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar10 * 4));
        }
        if (dVar11 <= dVar13) {
          dVar11 = dVar13;
        }
        lVar7 = lVar10;
      } while (lVar10 < A->ncol);
    }
    break;
  default:
    if (*norm == '1') goto switchD_001169dd_caseD_4f;
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'L':
  case 'N':
    pcVar6 = "Illegal norm specified.";
    uVar4 = 0x77;
LAB_00116aac:
    sprintf(local_138,"%s at line %d in file %s\n",pcVar6,uVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zlangs.c");
    superlu_abort_and_exit(local_138);
    dVar11 = 0.0;
  }
  return dVar11;
}

Assistant:

double zlangs(char *norm, SuperMatrix *A)
{
    
    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    int      i, j, irow;
    double   value = 0., sum;
    double   *rwork;

    Astore = A->Store;
    Aval   = Astore->nzval;
    
    if ( SUPERLU_MIN(A->nrow, A->ncol) == 0) {
    } else if (strncmp(norm, "M", 1)==0) {
	/* Find max(abs(A(i,j))). */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++)
		value = SUPERLU_MAX( value, z_abs( &Aval[i]) );
	
    } else if (strncmp(norm, "O", 1)==0 || *(unsigned char *)norm == '1') {
	/* Find norm1(A). */
	for (j = 0; j < A->ncol; ++j) {
	    sum = 0.;
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) 
		sum += z_abs( &Aval[i] );
	    value = SUPERLU_MAX(value,sum);
	}
	
    } else if (strncmp(norm, "I", 1)==0) {
	/* Find normI(A). */
	if ( !(rwork = (double *) SUPERLU_MALLOC(A->nrow * sizeof(double))) )
	    ABORT("SUPERLU_MALLOC fails for rwork.");
	for (i = 0; i < A->nrow; ++i) rwork[i] = 0.;
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) {
		irow = Astore->rowind[i];
		rwork[irow] += z_abs( &Aval[i] );
	    }
	for (i = 0; i < A->nrow; ++i)
	    value = SUPERLU_MAX(value, rwork[i]);
	
	SUPERLU_FREE (rwork);
	
    } else if (strncmp(norm, "F", 1)==0 || strncmp(norm, "E", 1)==0) {
	/* Find normF(A). */
	ABORT("Not implemented.");
    } else
	ABORT("Illegal norm specified.");

    return (value);

}